

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int kinLsDQJac(N_Vector u,N_Vector fu,SUNMatrix Jac,void *kinmem,N_Vector tmp1,N_Vector tmp2)

{
  int iVar1;
  KINMem in_RCX;
  long in_RDX;
  int retval;
  KINMem kin_mem;
  N_Vector in_stack_00000040;
  KINMem in_stack_00000048;
  SUNMatrix in_stack_00000050;
  N_Vector in_stack_00000058;
  N_Vector in_stack_00000060;
  N_Vector in_stack_000000a0;
  N_Vector in_stack_000000a8;
  KINMem in_stack_000000b0;
  undefined4 in_stack_000000b8;
  undefined4 in_stack_000000bc;
  N_Vector in_stack_000000c0;
  N_Vector in_stack_000000c8;
  int local_44;
  int local_4;
  
  if (in_RCX == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x2d1,"kinLsDQJac",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                    ,"KINSOL memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDX == 0) {
    KINProcessError(in_RCX,-2,0x2da,"kinLsDQJac",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                    ,"Linear solver memory is NULL.");
    local_4 = -2;
  }
  else {
    iVar1 = SUNMatGetID(in_RDX);
    if (iVar1 == 0) {
      local_44 = kinLsDenseDQJac(in_stack_00000060,in_stack_00000058,in_stack_00000050,
                                 in_stack_00000048,in_stack_00000040,u);
    }
    else {
      iVar1 = SUNMatGetID(in_RDX);
      if (iVar1 == 3) {
        local_44 = kinLsBandDQJac(in_stack_000000c8,in_stack_000000c0,
                                  (SUNMatrix)CONCAT44(in_stack_000000bc,in_stack_000000b8),
                                  in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
      }
      else {
        KINProcessError(in_RCX,-2,0x2ea,"kinLsDQJac",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                        ,"unrecognized matrix type for kinLsDQJac");
        local_44 = -2;
      }
    }
    local_4 = local_44;
  }
  return local_4;
}

Assistant:

int kinLsDQJac(N_Vector u, N_Vector fu, SUNMatrix Jac, void* kinmem,
               N_Vector tmp1, N_Vector tmp2)
{
  KINMem kin_mem;
  int retval;

  /* access KINMem structure */
  if (kinmem == NULL)
  {
    KINProcessError(NULL, KINLS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_KINMEM_NULL);
    return (KINLS_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  /* verify that Jac is non-NULL */
  if (Jac == NULL)
  {
    KINProcessError(kin_mem, KINLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_LMEM_NULL);
    return (KINLS_LMEM_NULL);
  }

  /* Call the matrix-structure-specific DQ approximation routine */
  if (SUNMatGetID(Jac) == SUNMATRIX_DENSE)
  {
    retval = kinLsDenseDQJac(u, fu, Jac, kin_mem, tmp1, tmp2);
  }
  else if (SUNMatGetID(Jac) == SUNMATRIX_BAND)
  {
    retval = kinLsBandDQJac(u, fu, Jac, kin_mem, tmp1, tmp2);
  }
  else
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "unrecognized matrix type for kinLsDQJac");
    retval = KIN_ILL_INPUT;
  }
  return (retval);
}